

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bignum.cc
# Opt level: O2

void TestSquare(void)

{
  bool bVar1;
  undefined1 in_CL;
  undefined1 uVar2;
  char *pcVar3;
  char *in_R8;
  char *in_R9;
  Bignum bignum;
  char buffer [1024];
  
  bignum.used_bigits_ = 0;
  bignum.exponent_ = 0;
  double_conversion::Bignum::AssignUInt16(&bignum,1);
  double_conversion::Bignum::Square(&bignum);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0x55a,0xc0802b,(char *)(ulong)bVar1,(bool)in_CL);
  pcVar3 = buffer;
  CheckEqualsHelper((char *)0x55b,0xc080e3,"1",buffer,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  double_conversion::Bignum::AssignUInt16(&bignum,2);
  double_conversion::Bignum::Square(&bignum);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0x55f,0xc0802b,(char *)(ulong)bVar1,(bool)uVar2);
  pcVar3 = buffer;
  CheckEqualsHelper((char *)0x560,0xc0c693,"4",buffer,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  double_conversion::Bignum::AssignUInt16(&bignum,10);
  double_conversion::Bignum::Square(&bignum);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0x564,0xc0802b,(char *)(ulong)bVar1,(bool)uVar2);
  pcVar3 = buffer;
  CheckEqualsHelper((char *)0x565,0xc0c697,"64",buffer,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  AssignHexString(&bignum,"FFFFFFF");
  double_conversion::Bignum::Square(&bignum);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0x569,0xc0802b,(char *)(ulong)bVar1,(bool)uVar2);
  pcVar3 = buffer;
  CheckEqualsHelper((char *)0x56a,0xc0c69c,"FFFFFFE0000001",buffer,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  AssignHexString(&bignum,"FFFFFFFFFFFFFF");
  double_conversion::Bignum::Square(&bignum);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0x56e,0xc0802b,(char *)(ulong)bVar1,(bool)uVar2);
  CheckEqualsHelper((char *)0x56f,0xc0c6bc,"FFFFFFFFFFFFFE00000000000001",buffer,in_R8,in_R9);
  return;
}

Assistant:

TEST(Square) {
  Bignum bignum;
  char buffer[kBufferSize];

  bignum.AssignUInt16(1);
  bignum.Square();
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1", buffer);

  bignum.AssignUInt16(2);
  bignum.Square();
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("4", buffer);

  bignum.AssignUInt16(10);
  bignum.Square();
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("64", buffer);

  AssignHexString(&bignum, "FFFFFFF");
  bignum.Square();
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("FFFFFFE0000001", buffer);

  AssignHexString(&bignum, "FFFFFFFFFFFFFF");
  bignum.Square();
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("FFFFFFFFFFFFFE00000000000001", buffer);
}